

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  int iVar1;
  size_t sVar2;
  ulong in_RCX;
  long *in_RDI;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t chunk_size;
  int ret;
  size_t in_stack_ffffffffffffff98;
  long *in_stack_ffffffffffffffa0;
  ptls_buffer_t *in_stack_ffffffffffffffa8;
  void *input;
  void *output;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  ulong local_38;
  int local_2c;
  ulong local_20;
  
  local_2c = 0;
  local_20 = in_RCX;
  while( true ) {
    if (local_20 == 0) {
      return local_2c;
    }
    local_38 = local_20;
    if (0x4000 < local_20) {
      local_38 = 0x4000;
    }
    uVar3 = 0x17;
    uVar4 = 3;
    uVar5 = 3;
    iVar1 = ptls_buffer__do_pushv
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                      );
    if (iVar1 != 0) {
      return iVar1;
    }
    output = (void *)0x2;
    in_stack_ffffffffffffff98 = 2;
    in_stack_ffffffffffffffa0 = in_RDI;
    iVar1 = ptls_buffer__do_pushv(in_stack_ffffffffffffffa8,in_RDI,2);
    if (iVar1 != 0) {
      return iVar1;
    }
    input = (void *)in_RDI[2];
    iVar1 = ptls_buffer_reserve(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
    if (iVar1 != 0) break;
    sVar2 = aead_encrypt((st_ptls_traffic_protection_t *)
                         CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(uVar3,in_stack_ffffffffffffffc0))),
                         output,input,(size_t)in_stack_ffffffffffffffa8,
                         (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
    in_RDI[2] = sVar2 + in_RDI[2];
    in_stack_ffffffffffffffa8 = (ptls_buffer_t *)(in_RDI[2] - (long)input);
    if (output == (void *)0xffffffffffffffff) {
      local_2c = ptls_buffer__adjust_quic_blocksize
                           ((ptls_buffer_t *)0xffffffffffffffff,(size_t)input);
      if (local_2c != 0) {
        return local_2c;
      }
    }
    else {
      for (; local_2c = 0, output != (void *)0x0; output = (void *)((long)output + -1)) {
        *(char *)((long)input + (*in_RDI - (long)output)) =
             (char)((ulong)in_stack_ffffffffffffffa8 >> (((char)output + -1) * '\b' & 0x3fU));
      }
    }
    local_20 = local_20 - local_38;
  }
  return iVar1;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(buf, chunk_size + enc->aead->algo->tag_size + 1)) != 0)
                goto Exit;
            buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
        });
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}